

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_particle_set.cpp
# Opt level: O3

void __thiscall
PP_particle_set::PP_particle_set(PP_particle_set *this,int N,double _R,double _m,double _e)

{
  PP_particle p_default;
  PP_particle local_70;
  
  (this->S).super__Vector_base<PP_particle,_std::allocator<PP_particle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->S).super__Vector_base<PP_particle,_std::allocator<PP_particle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->S).super__Vector_base<PP_particle,_std::allocator<PP_particle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->alpha = 1.0;
  PP_particle::PP_particle(&local_70);
  if (0 < N) {
    local_70.super_PP_object.R = _R;
    local_70.m = _m;
    local_70.e = _e;
    do {
      std::vector<PP_particle,_std::allocator<PP_particle>_>::push_back(&this->S,&local_70);
      N = N + -1;
    } while (N != 0);
  }
  return;
}

Assistant:

PP_particle_set::PP_particle_set(int N, double _R, double _m, double _e)
{
    alpha=1.0;
    PP_particle p_default;
    p_default.R=_R;
    p_default.m=_m;
    p_default.e=_e;
    for(int i=0 ; i<N ; i++)
        S.push_back(p_default);
}